

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void compute_luma_sq_error_sum
               (uint32_t *square_diff,uint32_t *luma_sse_sum,int block_height,int block_width,
               int ss_x_shift,int ss_y_shift)

{
  byte bVar1;
  int iVar2;
  int ww;
  int xx;
  int yy;
  int jj;
  int ii;
  int j;
  int i;
  int ss_y_shift_local;
  int ss_x_shift_local;
  int block_width_local;
  int block_height_local;
  uint32_t *luma_sse_sum_local;
  uint32_t *square_diff_local;
  
  for (i = 0; i < block_height; i = i + 1) {
    for (j = 0; j < block_width; j = j + 1) {
      for (ii = 0; ii < 1 << ((byte)ss_y_shift & 0x1f); ii = ii + 1) {
        for (jj = 0; bVar1 = (byte)ss_x_shift, jj < 1 << (bVar1 & 0x1f); jj = jj + 1) {
          iVar2 = i * block_width + j;
          luma_sse_sum[iVar2] =
               square_diff
               [((i << ((byte)ss_y_shift & 0x1f)) + ii) * (block_width << (bVar1 & 0x1f)) +
                (j << (bVar1 & 0x1f)) + jj] + luma_sse_sum[iVar2];
        }
      }
    }
  }
  return;
}

Assistant:

static void compute_luma_sq_error_sum(uint32_t *square_diff,
                                      uint32_t *luma_sse_sum, int block_height,
                                      int block_width, int ss_x_shift,
                                      int ss_y_shift) {
  for (int i = 0; i < block_height; ++i) {
    for (int j = 0; j < block_width; ++j) {
      for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
        for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
          const int yy = (i << ss_y_shift) + ii;     // Y-coord on Y-plane.
          const int xx = (j << ss_x_shift) + jj;     // X-coord on Y-plane.
          const int ww = block_width << ss_x_shift;  // Width of Y-plane.
          luma_sse_sum[i * block_width + j] += square_diff[yy * ww + xx];
        }
      }
    }
  }
}